

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int stb_vorbis_get_samples_short_interleaved
              (stb_vorbis *f,int channels,short *buffer,int num_shorts)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  stb_vorbis *in_RDX;
  int in_ESI;
  short *in_RDI;
  int k;
  int n;
  int len;
  float **outputs;
  int local_34;
  int local_30;
  float ***in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  
  iVar1 = in_ECX / in_ESI;
  local_30 = 0;
  while( true ) {
    if (iVar1 <= local_30) {
      return local_30;
    }
    local_34 = *(int *)(in_RDI + 0x3b4) - *(int *)(in_RDI + 0x3b2);
    if (iVar1 <= local_30 + local_34) {
      local_34 = iVar1 - local_30;
    }
    if (local_34 != 0) {
      convert_channels_short_interleaved
                (k,in_RDI,in_ESI,(float **)in_RDX,in_ECX,in_stack_ffffffffffffffe0);
    }
    in_RDX = (stb_vorbis *)((long)&in_RDX->sample_rate + (long)(local_34 * in_ESI) * 2);
    local_30 = local_34 + local_30;
    *(int *)(in_RDI + 0x3b2) = local_34 + *(int *)(in_RDI + 0x3b2);
    if (local_30 == iVar1) break;
    iVar2 = stb_vorbis_get_frame_float
                      (in_RDX,(int *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffd8);
    if (iVar2 == 0) {
      return local_30;
    }
  }
  return local_30;
}

Assistant:

int stb_vorbis_get_samples_short_interleaved(stb_vorbis *f, int channels, short *buffer, int num_shorts)
{
   float **outputs;
   int len = num_shorts / channels;
   int n=0;
   while (n < len) {
      int k = f->channel_buffer_end - f->channel_buffer_start;
      if (n+k >= len) k = len - n;
      if (k)
         convert_channels_short_interleaved(channels, buffer, f->channels, f->channel_buffers, f->channel_buffer_start, k);
      buffer += k*channels;
      n += k;
      f->channel_buffer_start += k;
      if (n == len) break;
      if (!stb_vorbis_get_frame_float(f, NULL, &outputs)) break;
   }
   return n;
}